

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_on_client_failed(intptr_t uuid,void *set_)

{
  http_s *h_00;
  http_s *h;
  http_settings_s *set;
  void *set__local;
  intptr_t uuid_local;
  
  h_00 = *(http_s **)((long)set_ + 0x20);
  *(void **)((long)set_ + 0x20) = h_00->udata;
  http_s_destroy(h_00,'\0');
  fio_free(h_00);
  if (*(long *)((long)set_ + 0x18) != 0) {
    (**(code **)((long)set_ + 0x18))(set_);
  }
  http_settings_free((http_settings_s *)set_);
  return;
}

Assistant:

static void http_on_client_failed(intptr_t uuid, void *set_) {
  http_settings_s *set = set_;
  http_s *h = set->udata;
  set->udata = h->udata;
  http_s_destroy(h, 0);
  fio_free(h);
  if (set->on_finish)
    set->on_finish(set);
  http_settings_free(set);
  (void)uuid;
}